

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O1

int __thiscall CNet::GetNumWire(CNet *this,int iMode,int iValue)

{
  pointer ppCVar1;
  CWire *this_00;
  int iVar2;
  pointer ppCVar3;
  CLayer *this_01;
  int iVar4;
  
  if (iMode == 0x100000) {
    ppCVar3 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar1 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar3 != ppCVar1) {
      iVar4 = 0;
      do {
        this_00 = *ppCVar3;
        iVar2 = CWire::IsCompleted(this_00);
        if ((iVar2 != 0) && (iVar2 = CWire::IsPoint(this_00), iVar2 == 0)) {
          this_01 = CWire::GetLayer(this_00);
          iVar2 = CLayer::Z(this_01);
          iVar4 = iVar4 + (uint)(iVar2 == iValue);
        }
        ppCVar3 = ppCVar3 + 1;
      } while (ppCVar3 != ppCVar1);
      return iVar4;
    }
  }
  else if (iMode == 1) {
    if (iValue == 3) goto LAB_0011994e;
    ppCVar3 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar1 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar3 != ppCVar1) {
      iVar4 = 0;
      do {
        iVar4 = (iVar4 + 1) - (uint)((((*ppCVar3)->super_CObject).m_iState & iValue) == 0);
        ppCVar3 = ppCVar3 + 1;
      } while (ppCVar3 != ppCVar1);
      return iVar4;
    }
  }
  else {
    if (iMode != 0) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                    ,0x228,"int CNet::GetNumWire(int, int)");
    }
    if (iValue == 0x30f) {
LAB_0011994e:
      return (int)((ulong)((long)(this->m_Wire).
                                 super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    ppCVar3 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar1 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar3 != ppCVar1) {
      iVar4 = 0;
      do {
        iVar4 = (iVar4 + 1) - (uint)((((*ppCVar3)->super_CObject).m_iProp & iValue) == 0);
        ppCVar3 = ppCVar3 + 1;
      } while (ppCVar3 != ppCVar1);
      return iVar4;
    }
  }
  return 0;
}

Assistant:

int CNet::GetNumWire(int iMode, int iValue)
{
	int	iNum	=	0;
	switch(iMode) {
	case GET_MODE_PROP:
		if(iValue==PROP_WIRE_ANY)	return	m_Wire.size();
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetProp()&iValue)	++iNum;
		}
		break;
	case GET_MODE_STATE:
		if(iValue==STATE_WIRE_ANY)	return	m_Wire.size();			
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetState()&iValue)	++iNum;
		}
		break;
	case GET_MODE_LAYER:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;

			if(pWire->IsCompleted()&&
				!pWire->IsPoint()&&
				pWire->GetLayer()->Z()==iValue)	++iNum;
		}
		break;
	default:
		assert(FALSE);
		break;
	}

	return	iNum;
}